

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

RPCErrorCode RPCErrorFromTransactionError(TransactionError terr)

{
  int in_EDI;
  long in_FS_OFFSET;
  undefined4 local_c;
  
  if (in_EDI == 2) {
    local_c = RPC_VERIFY_ALREADY_IN_UTXO_SET;
  }
  else if (in_EDI == 3) {
    local_c = RPC_TRANSACTION_REJECTED;
  }
  else {
    local_c = RPC_TRANSACTION_ERROR;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

RPCErrorCode RPCErrorFromTransactionError(TransactionError terr)
{
    switch (terr) {
        case TransactionError::MEMPOOL_REJECTED:
            return RPC_TRANSACTION_REJECTED;
        case TransactionError::ALREADY_IN_UTXO_SET:
            return RPC_VERIFY_ALREADY_IN_UTXO_SET;
        default: break;
    }
    return RPC_TRANSACTION_ERROR;
}